

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update4_ghosts(Integer g_a)

{
  char *name;
  logical lVar1;
  void *nelem;
  long lVar2;
  int *piVar3;
  long in_RDI;
  Integer me;
  void *rcv_ptr_orig;
  void *snd_ptr_orig;
  void *rcv_ptr;
  void *snd_ptr;
  char rcv_name [32];
  char send_name [32];
  char *current;
  char *cache;
  char **ptr_rcv;
  char **ptr_snd;
  int msglen;
  int *count;
  int *stride_rcv;
  int *stride_snd;
  Integer width [7];
  Integer index [7];
  Integer *length;
  Integer msgcnt;
  Integer pmax;
  Integer *proc_rem_rcv;
  Integer *proc_rem_snd;
  Integer elemsize;
  Integer ndim;
  Integer buflen;
  Integer bufsize;
  Integer *size;
  Integer handle;
  Integer i;
  Integer idx;
  undefined8 in_stack_fffffffffffffe68;
  int iVar4;
  Integer in_stack_fffffffffffffe70;
  char local_178 [24];
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  void *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  double *local_138;
  int *buf;
  int *in_stack_fffffffffffffee8;
  int *stride_arr;
  int *piVar5;
  double *pdVar6;
  C_Integer aCStack_f8 [8];
  long local_b8 [8];
  int *local_78;
  long local_70;
  long local_68;
  double *local_60;
  double *local_58;
  long local_50;
  long local_48;
  long local_40;
  double local_38;
  double *local_30;
  long local_28;
  long local_20;
  long local_18;
  Integer local_10;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_28 = in_RDI + 1000;
  local_10 = in_RDI;
  name = (char *)pnga_nodeid();
  lVar1 = pnga_has_ghosts(local_10);
  if (lVar1 != 0) {
    local_48 = (long)GA[local_28].ndim;
    pdVar6 = GA[local_28].cache;
    local_50 = (long)GA[local_28].elemsize;
    for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
      aCStack_f8[local_20] = GA[local_28].width[local_20];
    }
    local_70 = 0;
    pnga_proc_topology((Integer)ptr_rcv,(Integer)cache,(Integer *)current);
    local_138 = pdVar6 + 1;
    local_38 = *pdVar6;
    local_40 = (long)local_38 / local_50;
    local_30 = pdVar6;
    strcpy(&stack0xfffffffffffffea8,"send_buffer");
    strcpy(local_178,"receive_buffer");
    nelem = pnga_malloc(in_stack_fffffffffffffe70,iVar4,name);
    pnga_malloc((Integer)nelem,iVar4,name);
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      if (aCStack_f8[local_18] != 0) {
        local_58 = local_138 + 2;
        local_60 = local_138 + 3;
        pdVar6 = local_138 + 4;
        lVar2 = (long)pdVar6 + local_48 * 4;
        local_78 = (int *)(lVar2 + local_48 * 4);
        piVar3 = (int *)((long)local_78 + 8);
        buf = piVar3 + local_48;
        armci_write_strided(pdVar6,(int)((ulong)lVar2 >> 0x20),piVar3,in_stack_fffffffffffffee8,
                            (char *)local_138);
        iVar4 = (int)((ulong)lVar2 >> 0x20);
        if ((double)GAme != *local_58) {
          if (GA[local_28].nblock[local_18] % 2 == 0) {
            if (local_b8[local_18] % 2 == 0) {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
            else {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] % 2 == 0) {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
          }
          else {
            local_68 = (long)(GA[local_28].nblock[local_18] + -1);
            if (local_b8[local_18] % 2 == 0) {
              if (local_b8[local_18] != local_68) {
                armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea4);
              }
            }
            else {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] % 2 == 0) {
              if (local_b8[local_18] != 0) {
                armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
              }
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
            if (local_b8[local_18] == 0) {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] == local_68) {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
          }
        }
        local_70 = local_70 + 1;
        armci_read_strided(pdVar6,iVar4,piVar3,in_stack_fffffffffffffee8,(char *)local_138);
        local_58 = (double *)(buf + 4);
        local_60 = (double *)(buf + 6);
        piVar3 = buf + 8;
        piVar5 = piVar3 + local_48;
        local_78 = piVar5 + local_48;
        stride_arr = local_78 + 2;
        local_138 = (double *)(stride_arr + local_48);
        armci_write_strided(piVar3,(int)((ulong)piVar5 >> 0x20),stride_arr,in_stack_fffffffffffffee8
                            ,(char *)buf);
        iVar4 = (int)((ulong)piVar5 >> 0x20);
        if ((double)GAme != *local_60) {
          if (GA[local_28].nblock[local_18] % 2 == 0) {
            if (local_b8[local_18] % 2 == 0) {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
            else {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] % 2 == 0) {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
          }
          else {
            local_68 = (long)(GA[local_28].nblock[local_18] + -1);
            if (local_b8[local_18] % 2 == 0) {
              if (local_b8[local_18] != 0) {
                armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea4);
              }
            }
            else {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] % 2 == 0) {
              if (local_b8[local_18] != local_68) {
                armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
              }
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
            if (local_b8[local_18] == local_68) {
              armci_msg_snd(in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
            }
            if (local_b8[local_18] == 0) {
              armci_msg_rcv(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
            }
          }
        }
        armci_read_strided(piVar3,iVar4,stride_arr,in_stack_fffffffffffffee8,(char *)buf);
        local_70 = local_70 + 1;
      }
    }
    pnga_free((void *)0x22b0e8);
    pnga_free((void *)0x22b0f2);
  }
  return 1;
}

Assistant:

logical pnga_update4_ghosts(Integer g_a)
{
  Integer idx, i, handle=GA_OFFSET + g_a;
  Integer *size, bufsize, buflen, ndim, elemsize;
  Integer *proc_rem_snd, *proc_rem_rcv, pmax;
  Integer msgcnt, *length;
  Integer index[MAXDIM], width[MAXDIM];
  int *stride_snd, *stride_rcv, *count, msglen;
  char **ptr_snd, **ptr_rcv, *cache, *current;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  cache = (char *)GA[handle].cache;
  elemsize = GA[handle].elemsize;
  for (i=0; i<ndim; i++) {
    width[i] = (Integer)GA[handle].width[i];
  }

  msgcnt = 0;

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  size = (Integer*)cache;
  current = (char*)(size+1);
  bufsize = *size;
  buflen = bufsize/elemsize;
#if GHOST_PRINT
  printf("p[%d] bufsize: %d buflen: %d\n", GAme, bufsize, buflen);
  fflush(stdout);
#endif

  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* send messages in negative direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_write_strided\n",GAme);
      fflush(stdout);
#endif

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_read_strided\n",GAme);
      fflush(stdout);
#endif

      /* send messages in positive direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  return TRUE;
}